

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ShaderReturnCase::ShaderReturnCase
          (ShaderReturnCase *this,Context *context,char *name,char *description,bool isVertexCase,
          char *shaderSource,ShaderEvalFunc evalFunc,deUint32 requirements)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  undefined7 in_register_00000081;
  
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,isVertexCase,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderReturnCase_0211ffa0;
  this->m_requirements = requirements;
  strlen(shaderSource);
  if ((int)CONCAT71(in_register_00000081,isVertexCase) == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_ShaderRenderCase).m_fragShaderSource,0,
               (char *)(this->super_ShaderRenderCase).m_fragShaderSource._M_string_length,
               (ulong)shaderSource);
    pcVar2 = 
    "attribute highp   vec4 a_position;\nattribute highp   vec4 a_coords;\nvarying   mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_coords = a_coords;\n}\n"
    ;
    lVar1 = 0xa8;
    lVar3 = 0xa0;
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_ShaderRenderCase).m_vertShaderSource,0,
               (char *)(this->super_ShaderRenderCase).m_vertShaderSource._M_string_length,
               (ulong)shaderSource);
    pcVar2 = 
    "varying mediump vec4 v_color;\n\nvoid main (void)\n{\n    gl_FragColor = v_color;\n}\n";
    lVar1 = 200;
    lVar3 = 0xc0;
  }
  std::__cxx11::string::_M_replace
            ((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode +
             lVar3,0,*(char **)((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                       _vptr_TestNode + lVar1),(ulong)pcVar2);
  return;
}

Assistant:

ShaderReturnCase::ShaderReturnCase (Context& context, const char* name, const char* description, bool isVertexCase, const char* shaderSource, ShaderEvalFunc evalFunc, deUint32 requirements)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
	, m_requirements	(requirements)
{
	if (isVertexCase)
	{
		m_vertShaderSource = shaderSource;
		m_fragShaderSource =
			"varying mediump vec4 v_color;\n\n"
			"void main (void)\n"
			"{\n"
			"    gl_FragColor = v_color;\n"
			"}\n";
	}
	else
	{
		m_fragShaderSource = shaderSource;
		m_vertShaderSource =
			"attribute highp   vec4 a_position;\n"
			"attribute highp   vec4 a_coords;\n"
			"varying   mediump vec4 v_coords;\n\n"
			"void main (void)\n"
			"{\n"
			"    gl_Position = a_position;\n"
			"    v_coords = a_coords;\n"
			"}\n";
	}
}